

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

iterator __thiscall QByteArray::begin(QByteArray *this)

{
  char *pcVar1;
  
  pcVar1 = data(this);
  return pcVar1;
}

Assistant:

iterator begin() { return data(); }